

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O3

void aom_smooth_predictor_4x16_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined1 auVar1 [16];
  uint uVar2;
  undefined1 auVar3 [16];
  int iVar4;
  uint8_t *puVar5;
  undefined1 auVar6 [16];
  undefined2 uVar8;
  undefined2 uVar9;
  undefined1 auVar7 [16];
  undefined1 auVar10 [16];
  __m128i d;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i rep;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  byte bStack_9;
  undefined1 auVar19 [16];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar16 [16];
  undefined1 auVar21 [16];
  undefined1 auVar25 [16];
  undefined1 auVar31 [16];
  undefined1 auVar26 [16];
  undefined1 auVar32 [16];
  undefined1 auVar27 [16];
  undefined1 auVar33 [16];
  
  auVar12 = _DAT_0050d7f0;
  auVar11 = _DAT_0050d7e0;
  auVar3 = _DAT_0050d780;
  uVar2 = *(uint *)above;
  auVar1 = *(undefined1 (*) [16])left;
  auVar7 = pshuflw(ZEXT416(uVar2 >> 0x18),ZEXT416(uVar2 >> 0x18),0);
  bStack_9 = auVar1[0xf];
  auVar10 = pshuflw(ZEXT116(bStack_9),ZEXT116(bStack_9),0);
  auVar6[0] = (byte)uVar2;
  auVar6[1] = 0;
  auVar29._0_12_ = ZEXT712(0);
  auVar29[0xc] = (char)(uVar2 >> 0x18);
  auVar29[0xd] = 0;
  auVar29._14_2_ = auVar10._6_2_;
  auVar17._12_4_ = auVar29._12_4_;
  auVar17._0_10_ = (unkuint10)0;
  auVar17._10_2_ = auVar10._4_2_;
  auVar6[9] = 0;
  auVar6[8] = (byte)(uVar2 >> 0x10);
  auVar6._10_6_ = auVar17._10_6_;
  auVar6._6_2_ = auVar10._2_2_;
  auVar6[5] = 0;
  auVar6[4] = (byte)(uVar2 >> 8);
  auVar6._2_2_ = auVar10._0_2_;
  iVar4 = 8;
  puVar5 = dst;
  auVar17 = _DAT_0050d750;
  auVar29 = _DAT_004d28e0;
  do {
    auVar10 = pshufb(auVar11,auVar17);
    auVar22 = pshufb(auVar12,auVar17);
    auVar16._0_12_ = auVar10._0_12_;
    auVar16._12_2_ = auVar10._6_2_;
    auVar16._14_2_ = auVar22._6_2_;
    auVar15._12_4_ = auVar16._12_4_;
    auVar15._0_10_ = auVar10._0_10_;
    auVar15._10_2_ = auVar22._4_2_;
    auVar23._10_6_ = auVar15._10_6_;
    auVar23._0_8_ = auVar10._0_8_;
    auVar23._8_2_ = auVar10._4_2_;
    auVar14._8_8_ = auVar23._8_8_;
    auVar14._6_2_ = auVar22._2_2_;
    auVar14._4_2_ = auVar10._2_2_;
    auVar14._0_2_ = auVar10._0_2_;
    auVar14._2_2_ = auVar22._0_2_;
    auVar10 = pmaddwd(auVar14,auVar6);
    auVar23 = pshufb(auVar1,auVar29);
    uVar9 = auVar7._2_2_;
    auVar27._0_12_ = auVar23._0_12_;
    auVar27._12_2_ = auVar23._6_2_;
    auVar27._14_2_ = uVar9;
    uVar8 = auVar7._0_2_;
    auVar26._12_4_ = auVar27._12_4_;
    auVar26._0_10_ = auVar23._0_10_;
    auVar26._10_2_ = uVar8;
    auVar25._10_6_ = auVar26._10_6_;
    auVar25._0_8_ = auVar23._0_8_;
    auVar25._8_2_ = auVar23._4_2_;
    auVar24._8_8_ = auVar25._8_8_;
    auVar24._6_2_ = uVar9;
    auVar24._4_2_ = auVar23._2_2_;
    auVar24._0_2_ = auVar23._0_2_;
    auVar24._2_2_ = uVar8;
    auVar23 = pmaddwd(auVar24,auVar3);
    auVar28._0_4_ = auVar23._0_4_ + auVar10._0_4_ + 0x100U >> 9;
    auVar28._4_4_ = auVar23._4_4_ + auVar10._4_4_ + 0x100U >> 9;
    auVar28._8_4_ = auVar23._8_4_ + auVar10._8_4_ + 0x100U >> 9;
    auVar28._12_4_ = auVar23._12_4_ + auVar10._12_4_ + 0x100U >> 9;
    auVar10 = pshufb(auVar28,ZEXT416(0xc080400));
    *(int *)puVar5 = auVar10._0_4_;
    auVar23 = _DAT_0050d820;
    auVar10 = _DAT_0050d810;
    puVar5 = puVar5 + stride;
    auVar13._0_2_ = auVar29._0_2_ + 1;
    auVar13._2_2_ = auVar29._2_2_ + 1;
    auVar13._4_2_ = auVar29._4_2_ + 1;
    auVar13._6_2_ = auVar29._6_2_ + 1;
    auVar13._8_2_ = auVar29._8_2_ + 1;
    auVar13._10_2_ = auVar29._10_2_ + 1;
    auVar13._12_2_ = auVar29._12_2_ + 1;
    auVar13._14_2_ = auVar29._14_2_ + 1;
    auVar22._0_2_ = auVar17._0_2_ + 0x202;
    auVar22._2_2_ = auVar17._2_2_ + 0x202;
    auVar22._4_2_ = auVar17._4_2_ + 0x202;
    auVar22._6_2_ = auVar17._6_2_ + 0x202;
    auVar22._8_2_ = auVar17._8_2_ + 0x202;
    auVar22._10_2_ = auVar17._10_2_ + 0x202;
    auVar22._12_2_ = auVar17._12_2_ + 0x202;
    auVar22._14_2_ = auVar17._14_2_ + 0x202;
    iVar4 = iVar4 + -1;
    auVar17 = auVar22;
    auVar29 = auVar13;
  } while (iVar4 != 0);
  puVar5 = dst + stride * 8;
  iVar4 = 8;
  auVar11 = _DAT_0050d750;
  auVar12 = _DAT_0050d800;
  do {
    auVar17 = pshufb(auVar10,auVar11);
    auVar29 = pshufb(auVar23,auVar11);
    auVar21._0_12_ = auVar17._0_12_;
    auVar21._12_2_ = auVar17._6_2_;
    auVar21._14_2_ = auVar29._6_2_;
    auVar20._12_4_ = auVar21._12_4_;
    auVar20._0_10_ = auVar17._0_10_;
    auVar20._10_2_ = auVar29._4_2_;
    auVar19._10_6_ = auVar20._10_6_;
    auVar19._0_8_ = auVar17._0_8_;
    auVar19._8_2_ = auVar17._4_2_;
    auVar18._8_8_ = auVar19._8_8_;
    auVar18._6_2_ = auVar29._2_2_;
    auVar18._4_2_ = auVar17._2_2_;
    auVar18._0_2_ = auVar17._0_2_;
    auVar18._2_2_ = auVar29._0_2_;
    auVar17 = pmaddwd(auVar18,auVar6);
    auVar29 = pshufb(auVar1,auVar12);
    auVar33._0_12_ = auVar29._0_12_;
    auVar33._12_2_ = auVar29._6_2_;
    auVar33._14_2_ = uVar9;
    auVar32._12_4_ = auVar33._12_4_;
    auVar32._0_10_ = auVar29._0_10_;
    auVar32._10_2_ = uVar8;
    auVar31._10_6_ = auVar32._10_6_;
    auVar31._0_8_ = auVar29._0_8_;
    auVar31._8_2_ = auVar29._4_2_;
    auVar30._8_8_ = auVar31._8_8_;
    auVar30._6_2_ = uVar9;
    auVar30._4_2_ = auVar29._2_2_;
    auVar30._0_2_ = auVar29._0_2_;
    auVar30._2_2_ = uVar8;
    auVar29 = pmaddwd(auVar30,auVar3);
    auVar34._0_4_ = auVar29._0_4_ + auVar17._0_4_ + 0x100U >> 9;
    auVar34._4_4_ = auVar29._4_4_ + auVar17._4_4_ + 0x100U >> 9;
    auVar34._8_4_ = auVar29._8_4_ + auVar17._8_4_ + 0x100U >> 9;
    auVar34._12_4_ = auVar29._12_4_ + auVar17._12_4_ + 0x100U >> 9;
    auVar17 = pshufb(auVar34,ZEXT416(0xc080400));
    *(int *)puVar5 = auVar17._0_4_;
    puVar5 = puVar5 + stride;
    auVar7._0_2_ = auVar12._0_2_ + 1;
    auVar7._2_2_ = auVar12._2_2_ + 1;
    auVar7._4_2_ = auVar12._4_2_ + 1;
    auVar7._6_2_ = auVar12._6_2_ + 1;
    auVar7._8_2_ = auVar12._8_2_ + 1;
    auVar7._10_2_ = auVar12._10_2_ + 1;
    auVar7._12_2_ = auVar12._12_2_ + 1;
    auVar7._14_2_ = auVar12._14_2_ + 1;
    auVar12._0_2_ = auVar11._0_2_ + 0x202;
    auVar12._2_2_ = auVar11._2_2_ + 0x202;
    auVar12._4_2_ = auVar11._4_2_ + 0x202;
    auVar12._6_2_ = auVar11._6_2_ + 0x202;
    auVar12._8_2_ = auVar11._8_2_ + 0x202;
    auVar12._10_2_ = auVar11._10_2_ + 0x202;
    auVar12._12_2_ = auVar11._12_2_ + 0x202;
    auVar12._14_2_ = auVar11._14_2_ + 0x202;
    iVar4 = iVar4 + -1;
    auVar11 = auVar12;
    auVar12 = auVar7;
  } while (iVar4 != 0);
  return;
}

Assistant:

static inline void load_pixel_w4(const uint8_t *above, const uint8_t *left,
                                 int height, __m128i *pixels) {
  __m128i d = _mm_cvtsi32_si128(((const int *)above)[0]);
  if (height == 4)
    pixels[1] = _mm_cvtsi32_si128(((const int *)left)[0]);
  else if (height == 8)
    pixels[1] = _mm_loadl_epi64(((const __m128i *)left));
  else
    pixels[1] = _mm_loadu_si128(((const __m128i *)left));

  pixels[2] = _mm_set1_epi16((int16_t)above[3]);

  const __m128i bp = _mm_set1_epi16((int16_t)left[height - 1]);
  const __m128i zero = _mm_setzero_si128();
  d = _mm_unpacklo_epi8(d, zero);
  pixels[0] = _mm_unpacklo_epi16(d, bp);
}